

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::UpdateTxInSequenceRequest::ConvertFromStruct
          (UpdateTxInSequenceRequest *this,UpdateTxInSequenceRequestStruct *data)

{
  UpdateTxInSequenceRequestStruct *data_local;
  UpdateTxInSequenceRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->tx_,(string *)data);
  this->is_elements_ = (bool)(data->is_elements & 1);
  std::__cxx11::string::operator=((string *)&this->txid_,(string *)&data->txid);
  this->vout_ = data->vout;
  this->sequence_ = data->sequence;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void UpdateTxInSequenceRequest::ConvertFromStruct(
    const UpdateTxInSequenceRequestStruct& data) {
  tx_ = data.tx;
  is_elements_ = data.is_elements;
  txid_ = data.txid;
  vout_ = data.vout;
  sequence_ = data.sequence;
  ignore_items = data.ignore_items;
}